

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alcmain.h
# Opt level: O3

ALuint __thiscall ALCdevice::channelsFromFmt(ALCdevice *this)

{
  int iVar1;
  
  switch(this->FmtChans) {
  case DevFmtMono:
    return 1;
  case DevFmtChannelsDefault:
    return 2;
  case DevFmtQuad:
    return 4;
  case DevFmtX51:
  case DevFmtX51Rear:
    return 6;
  case DevFmtX61:
    return 7;
  case DevFmtX71:
    return 8;
  case DevFmtAmbi3D:
    iVar1 = this->mAmbiOrder + 1;
    return iVar1 * iVar1;
  default:
    return 0;
  }
}

Assistant:

ALuint channelsFromFmt() const noexcept { return ChannelsFromDevFmt(FmtChans, mAmbiOrder); }